

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_groups.c
# Opt level: O2

int map_sort_compar(void *l,void *r)

{
  if (*(ulong *)((long)r + 8) <= *(ulong *)((long)l + 8)) {
    if (*(ulong *)((long)r + 8) < *(ulong *)((long)l + 8)) {
      return 1;
    }
    if (*r <= *l) {
      return (int)(*r < *l);
    }
  }
  return -1;
}

Assistant:

static int
map_sort_compar(const void*l, const void*r)
{
    struct temp_map_struc_s *lv = (struct temp_map_struc_s *)l;
    struct temp_map_struc_s *rv = (struct temp_map_struc_s *)r;

    if (lv->group < rv->group) {
        return -1;
    }
    if (lv->group > rv->group) {
        return 1;
    }
    if (lv->section < rv->section) {
        return -1;
    }
    if (lv->section > rv->section) {
        return 1;
    }
    /* Should never get here! */
    return 0;

}